

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O3

void __thiscall
amrex::EB2::Level::fillFaceCent(Level *this,Array<MultiCutFab_*,_3> *a_facecent,Geometry *geom)

{
  int iVar1;
  int ncomp;
  MultiCutFab *dstmf;
  int idim;
  long lVar2;
  FabArray<amrex::FArrayBox> *pFVar3;
  undefined8 local_208;
  int local_200;
  Geometry *local_1f8;
  FabArray<amrex::FArrayBox> *local_1f0;
  Periodicity local_1e8;
  MFInfo local_1d8;
  MultiFab tmp;
  
  local_1f8 = geom;
  if (this->m_allregular == true) {
    lVar2 = 0;
    do {
      MultiCutFab::setVal(a_facecent->_M_elems[lVar2],0.0);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  else {
    pFVar3 = (FabArray<amrex::FArrayBox> *)&this->m_facecent;
    lVar2 = 0;
    do {
      dstmf = a_facecent->_M_elems[lVar2];
      local_1d8.alloc = true;
      local_1d8._1_7_ = 0;
      local_1d8.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1d8.arena = (Arena *)0x0;
      local_1d8.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_208 = &PTR__FabFactory_00712918;
      MultiFab::MultiFab((MultiFab *)&tmp.super_FabArray<amrex::FArrayBox>,
                         &(dstmf->m_data).super_FabArrayBase.boxarray,
                         &(dstmf->m_data).super_FabArrayBase.distributionMap,
                         (dstmf->m_data).super_FabArrayBase.n_comp,
                         (dstmf->m_data).super_FabArrayBase.n_grow.vect[0],&local_1d8,
                         (FabFactory<amrex::FArrayBox> *)&local_208);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1d8.tags.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
      FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (&tmp.super_FabArray<amrex::FArrayBox>,0.0,0,
                 tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp,
                 &tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow);
      iVar1 = (dstmf->m_data).super_FabArrayBase.n_grow.vect[0];
      ncomp = (dstmf->m_data).super_FabArrayBase.n_comp;
      local_1f0 = pFVar3;
      local_1e8 = Geometry::periodicity(local_1f8);
      pFVar3 = local_1f0;
      local_1d8.alloc = false;
      local_1d8._1_7_ = 0;
      local_1d8.arena = (Arena *)((ulong)local_1d8.arena & 0xffffffff00000000);
      local_208._4_4_ = iVar1;
      local_208._0_4_ = iVar1;
      local_200 = iVar1;
      FabArray<amrex::FArrayBox>::ParallelCopy_nowait
                (&tmp.super_FabArray<amrex::FArrayBox>,local_1f0,0,0,ncomp,(IntVect *)&local_1d8,
                 (IntVect *)&local_208,&local_1e8,COPY,(CPC *)0x0,false);
      anon_unknown_2::copyMultiFabToMultiCutFab
                (dstmf,(MultiFab *)&tmp.super_FabArray<amrex::FArrayBox>);
      MultiFab::~MultiFab((MultiFab *)&tmp.super_FabArray<amrex::FArrayBox>);
      lVar2 = lVar2 + 1;
      pFVar3 = pFVar3 + 1;
    } while (lVar2 != 3);
  }
  return;
}

Assistant:

void
Level::fillFaceCent (Array<MultiCutFab*,AMREX_SPACEDIM> const& a_facecent, const Geometry& geom) const
{
    if (isAllRegular()) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            a_facecent[idim]->setVal(0.0);
        }
        return;
    }

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        MultiCutFab& facecent = *a_facecent[idim];
        MultiFab tmp(facecent.boxArray(), facecent.DistributionMap(),
                     facecent.nComp(), facecent.nGrow());
        tmp.setVal(0.0);
        tmp.ParallelCopy(m_facecent[idim],0,0,facecent.nComp(),
                         0,facecent.nGrow(),geom.periodicity());
        copyMultiFabToMultiCutFab(facecent,tmp);
    }
}